

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress.c
# Opt level: O0

int Curl_pgrsUpdate(connectdata *conn)

{
  Curl_easy *data_00;
  FILE *whereto;
  bool bVar1;
  long lVar2;
  timeval *ptVar3;
  long lVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  int iVar11;
  double dVar12;
  timeval newer;
  long local_1b8;
  long local_1a8;
  curl_off_t local_1a0;
  long local_190;
  curl_off_t local_178;
  int local_170;
  int local_16c;
  curl_off_t local_168;
  double local_160;
  double local_150;
  curl_off_t amount;
  time_t span_ms;
  __suseconds_t local_128;
  _Bool shownow;
  curl_off_t total_estimate;
  curl_off_t dlestimate;
  curl_off_t ulestimate;
  char time_spent [10];
  char time_total [10];
  char time_left [10];
  int countindex;
  int checkindex;
  int nowindex;
  Curl_easy *data;
  curl_off_t timespent;
  curl_off_t total_expected_transfer;
  curl_off_t total_transfer;
  curl_off_t total_percen;
  curl_off_t ulpercen;
  curl_off_t dlpercen;
  char max5 [6] [10];
  int result;
  timeval now;
  connectdata *conn_local;
  
  ulpercen = 0;
  total_percen = 0;
  total_transfer = 0;
  data_00 = conn->data;
  iVar11 = (data_00->progress).speeder_c % 6;
  dlestimate = 0;
  total_estimate = 0;
  bVar1 = false;
  newer = curlx_tvnow();
  span_ms = newer.tv_sec;
  local_128 = newer.tv_usec;
  dVar12 = curlx_tvdiff_secs(newer,(data_00->progress).start);
  (data_00->progress).timespent = dVar12;
  lVar2 = (long)(data_00->progress).timespent;
  if ((data_00->progress).timespent <= 0.0) {
    local_150 = 1.0;
  }
  else {
    local_150 = (data_00->progress).timespent;
  }
  (data_00->progress).dlspeed = (long)((double)(data_00->progress).downloaded / local_150);
  if ((data_00->progress).timespent <= 0.0) {
    local_160 = 1.0;
  }
  else {
    local_160 = (data_00->progress).timespent;
  }
  (data_00->progress).ulspeed = (long)((double)(data_00->progress).uploaded / local_160);
  if ((data_00->progress).lastshow != span_ms) {
    bVar1 = true;
    (data_00->progress).lastshow = span_ms;
    if ((data_00->progress).uploaded < (data_00->progress).downloaded) {
      local_168 = (data_00->progress).downloaded;
    }
    else {
      local_168 = (data_00->progress).uploaded;
    }
    (data_00->progress).speeder[iVar11] = local_168;
    ptVar3 = (data_00->progress).speeder_time + iVar11;
    ptVar3->tv_sec = span_ms;
    ptVar3->tv_usec = local_128;
    (data_00->progress).speeder_c = (data_00->progress).speeder_c + 1;
    if ((data_00->progress).speeder_c < 6) {
      local_16c = (data_00->progress).speeder_c;
    }
    else {
      local_16c = 6;
    }
    if (local_16c == 1) {
      if ((data_00->progress).dlspeed < (data_00->progress).ulspeed) {
        local_178 = (data_00->progress).ulspeed;
      }
      else {
        local_178 = (data_00->progress).dlspeed;
      }
      (data_00->progress).current_speed = local_178;
    }
    else {
      if ((data_00->progress).speeder_c < 6) {
        local_170 = 0;
      }
      else {
        local_170 = (data_00->progress).speeder_c % 6;
      }
      amount = curlx_tvdiff(newer,(data_00->progress).speeder_time[local_170]);
      if (amount == 0) {
        amount = 1;
      }
      lVar4 = (data_00->progress).speeder[iVar11] - (data_00->progress).speeder[local_170];
      if (lVar4 < 0x418938) {
        (data_00->progress).current_speed = (lVar4 * 1000) / amount;
      }
      else {
        (data_00->progress).current_speed = (long)((double)lVar4 / ((double)amount / 1000.0));
      }
    }
  }
  if (((data_00->progress).flags & 0x10U) == 0) {
    if ((data_00->set).fxferinfo != (curl_xferinfo_callback)0x0) {
      iVar11 = (*(data_00->set).fxferinfo)
                         ((data_00->set).progress_client,(data_00->progress).size_dl,
                          (data_00->progress).downloaded,(data_00->progress).size_ul,
                          (data_00->progress).uploaded);
      if (iVar11 == 0) {
        return 0;
      }
      Curl_failf(data_00,"Callback aborted");
      return iVar11;
    }
    if ((data_00->set).fprogress != (curl_progress_callback)0x0) {
      iVar11 = (*(data_00->set).fprogress)
                         ((data_00->set).progress_client,(double)(data_00->progress).size_dl,
                          (double)(data_00->progress).downloaded,(double)(data_00->progress).size_ul
                          ,(double)(data_00->progress).uploaded);
      if (iVar11 == 0) {
        return 0;
      }
      Curl_failf(data_00,"Callback aborted");
      return iVar11;
    }
    if (!bVar1) {
      return 0;
    }
    if (((data_00->progress).flags & 0x80U) == 0) {
      if ((data_00->state).resume_from != 0) {
        curl_mfprintf((data_00->set).err,"** Resuming transfer from byte position %ld\n",
                      (data_00->state).resume_from);
      }
      curl_mfprintf((data_00->set).err,
                    "  %% Total    %% Received %% Xferd  Average Speed   Time    Time     Time  Current\n                                 Dload  Upload   Total   Spent    Left  Speed\n"
                   );
      (data_00->progress).flags = (data_00->progress).flags | 0x80;
    }
    if ((((data_00->progress).flags & 0x20U) != 0) && (0 < (data_00->progress).ulspeed)) {
      dlestimate = (data_00->progress).size_ul / (data_00->progress).ulspeed;
      if ((data_00->progress).size_ul < 0x2711) {
        if (0 < (data_00->progress).size_ul) {
          total_percen = ((data_00->progress).uploaded * 100) / (data_00->progress).size_ul;
        }
      }
      else {
        total_percen = (data_00->progress).uploaded / ((data_00->progress).size_ul / 100);
      }
    }
    if ((((data_00->progress).flags & 0x40U) != 0) && (0 < (data_00->progress).dlspeed)) {
      total_estimate = (data_00->progress).size_dl / (data_00->progress).dlspeed;
      if ((data_00->progress).size_dl < 0x2711) {
        if (0 < (data_00->progress).size_dl) {
          ulpercen = ((data_00->progress).downloaded * 100) / (data_00->progress).size_dl;
        }
      }
      else {
        ulpercen = (data_00->progress).downloaded / ((data_00->progress).size_dl / 100);
      }
    }
    if (total_estimate < dlestimate) {
      local_190 = dlestimate;
    }
    else {
      local_190 = total_estimate;
    }
    if (local_190 < 1) {
      local_1a0 = 0;
    }
    else {
      local_1a0 = local_190 - lVar2;
    }
    time2str(time_total + 2,local_1a0);
    time2str(time_spent + 2,local_190);
    time2str((char *)((long)&ulestimate + 6),lVar2);
    if (((data_00->progress).flags & 0x20U) == 0) {
      local_1a8 = (data_00->progress).uploaded;
    }
    else {
      local_1a8 = (data_00->progress).size_ul;
    }
    if (((data_00->progress).flags & 0x40U) == 0) {
      local_1b8 = (data_00->progress).downloaded;
    }
    else {
      local_1b8 = (data_00->progress).size_dl;
    }
    lVar2 = local_1a8 + local_1b8;
    lVar4 = (data_00->progress).downloaded + (data_00->progress).uploaded;
    if (lVar2 < 0x2711) {
      if (0 < lVar2) {
        total_transfer = (lVar4 * 100) / lVar2;
      }
    }
    else {
      total_transfer = lVar4 / (lVar2 / 100);
    }
    whereto = (data_00->set).err;
    pcVar5 = max5data(lVar2,max5[1] + 2);
    pcVar6 = max5data((data_00->progress).downloaded,(char *)&dlpercen);
    pcVar7 = max5data((data_00->progress).uploaded,max5[0] + 2);
    pcVar8 = max5data((data_00->progress).dlspeed,max5[2] + 2);
    pcVar9 = max5data((data_00->progress).ulspeed,max5[3] + 2);
    pcVar10 = max5data((data_00->progress).current_speed,max5[4] + 2);
    curl_mfprintf(whereto,"\r%3ld %s  %3ld %s  %3ld %s  %s  %s %s %s %s %s",total_transfer,pcVar5,
                  ulpercen,pcVar6,total_percen,pcVar7,pcVar8,pcVar9,time_spent + 2,
                  (long)&ulestimate + 6,time_total + 2,pcVar10);
    fflush((FILE *)(data_00->set).err);
  }
  return 0;
}

Assistant:

int Curl_pgrsUpdate(struct connectdata *conn)
{
  struct timeval now;
  int result;
  char max5[6][10];
  curl_off_t dlpercen=0;
  curl_off_t ulpercen=0;
  curl_off_t total_percen=0;
  curl_off_t total_transfer;
  curl_off_t total_expected_transfer;
  curl_off_t timespent;
  struct Curl_easy *data = conn->data;
  int nowindex = data->progress.speeder_c% CURR_TIME;
  int checkindex;
  int countindex; /* amount of seconds stored in the speeder array */
  char time_left[10];
  char time_total[10];
  char time_spent[10];
  curl_off_t ulestimate=0;
  curl_off_t dlestimate=0;
  curl_off_t total_estimate;
  bool shownow=FALSE;

  now = Curl_tvnow(); /* what time is it */

  /* The time spent so far (from the start) */
  data->progress.timespent = curlx_tvdiff_secs(now, data->progress.start);
  timespent = (curl_off_t)data->progress.timespent;

  /* The average download speed this far */
  data->progress.dlspeed = (curl_off_t)
    ((double)data->progress.downloaded/
     (data->progress.timespent>0?data->progress.timespent:1));

  /* The average upload speed this far */
  data->progress.ulspeed = (curl_off_t)
    ((double)data->progress.uploaded/
     (data->progress.timespent>0?data->progress.timespent:1));

  /* Calculations done at most once a second, unless end is reached */
  if(data->progress.lastshow != now.tv_sec) {
    shownow = TRUE;

    data->progress.lastshow = now.tv_sec;

    /* Let's do the "current speed" thing, which should use the fastest
       of the dl/ul speeds. Store the faster speed at entry 'nowindex'. */
    data->progress.speeder[ nowindex ] =
      data->progress.downloaded>data->progress.uploaded?
      data->progress.downloaded:data->progress.uploaded;

    /* remember the exact time for this moment */
    data->progress.speeder_time [ nowindex ] = now;

    /* advance our speeder_c counter, which is increased every time we get
       here and we expect it to never wrap as 2^32 is a lot of seconds! */
    data->progress.speeder_c++;

    /* figure out how many index entries of data we have stored in our speeder
       array. With N_ENTRIES filled in, we have about N_ENTRIES-1 seconds of
       transfer. Imagine, after one second we have filled in two entries,
       after two seconds we've filled in three entries etc. */
    countindex = ((data->progress.speeder_c>=CURR_TIME)?
                  CURR_TIME:data->progress.speeder_c) - 1;

    /* first of all, we don't do this if there's no counted seconds yet */
    if(countindex) {
      time_t span_ms;

      /* Get the index position to compare with the 'nowindex' position.
         Get the oldest entry possible. While we have less than CURR_TIME
         entries, the first entry will remain the oldest. */
      checkindex = (data->progress.speeder_c>=CURR_TIME)?
        data->progress.speeder_c%CURR_TIME:0;

      /* Figure out the exact time for the time span */
      span_ms = Curl_tvdiff(now,
                            data->progress.speeder_time[checkindex]);
      if(0 == span_ms)
        span_ms=1; /* at least one millisecond MUST have passed */

      /* Calculate the average speed the last 'span_ms' milliseconds */
      {
        curl_off_t amount = data->progress.speeder[nowindex]-
          data->progress.speeder[checkindex];

        if(amount > CURL_OFF_T_C(4294967) /* 0xffffffff/1000 */)
          /* the 'amount' value is bigger than would fit in 32 bits if
             multiplied with 1000, so we use the double math for this */
          data->progress.current_speed = (curl_off_t)
            ((double)amount/((double)span_ms/1000.0));
        else
          /* the 'amount' value is small enough to fit within 32 bits even
             when multiplied with 1000 */
          data->progress.current_speed = amount*CURL_OFF_T_C(1000)/span_ms;
      }
    }
    else
      /* the first second we use the main average */
      data->progress.current_speed =
        (data->progress.ulspeed>data->progress.dlspeed)?
        data->progress.ulspeed:data->progress.dlspeed;

  } /* Calculations end */

  if(!(data->progress.flags & PGRS_HIDE)) {
    /* progress meter has not been shut off */

    if(data->set.fxferinfo) {
      /* There's a callback set, call that */
      result= data->set.fxferinfo(data->set.progress_client,
                                  data->progress.size_dl,
                                  data->progress.downloaded,
                                  data->progress.size_ul,
                                  data->progress.uploaded);
      if(result)
        failf(data, "Callback aborted");
      return result;
    }
    if(data->set.fprogress) {
      /* The older deprecated callback is set, call that */
      result= data->set.fprogress(data->set.progress_client,
                                  (double)data->progress.size_dl,
                                  (double)data->progress.downloaded,
                                  (double)data->progress.size_ul,
                                  (double)data->progress.uploaded);
      if(result)
        failf(data, "Callback aborted");
      return result;
    }

    if(!shownow)
      /* only show the internal progress meter once per second */
      return 0;

    /* If there's no external callback set, use internal code to show
       progress */

    if(!(data->progress.flags & PGRS_HEADERS_OUT)) {
      if(data->state.resume_from) {
        fprintf(data->set.err,
                "** Resuming transfer from byte position %"
                CURL_FORMAT_CURL_OFF_T "\n", data->state.resume_from);
      }
      fprintf(data->set.err,
              "  %% Total    %% Received %% Xferd  Average Speed   "
              "Time    Time     Time  Current\n"
              "                                 Dload  Upload   "
              "Total   Spent    Left  Speed\n");
      data->progress.flags |= PGRS_HEADERS_OUT; /* headers are shown */
    }

    /* Figure out the estimated time of arrival for the upload */
    if((data->progress.flags & PGRS_UL_SIZE_KNOWN) &&
       (data->progress.ulspeed > CURL_OFF_T_C(0))) {
      ulestimate = data->progress.size_ul / data->progress.ulspeed;

      if(data->progress.size_ul > CURL_OFF_T_C(10000))
        ulpercen = data->progress.uploaded /
          (data->progress.size_ul/CURL_OFF_T_C(100));
      else if(data->progress.size_ul > CURL_OFF_T_C(0))
        ulpercen = (data->progress.uploaded*100) /
          data->progress.size_ul;
    }

    /* ... and the download */
    if((data->progress.flags & PGRS_DL_SIZE_KNOWN) &&
       (data->progress.dlspeed > CURL_OFF_T_C(0))) {
      dlestimate = data->progress.size_dl / data->progress.dlspeed;

      if(data->progress.size_dl > CURL_OFF_T_C(10000))
        dlpercen = data->progress.downloaded /
          (data->progress.size_dl/CURL_OFF_T_C(100));
      else if(data->progress.size_dl > CURL_OFF_T_C(0))
        dlpercen = (data->progress.downloaded*100) /
          data->progress.size_dl;
    }

    /* Now figure out which of them is slower and use that one for the
       total estimate! */
    total_estimate = ulestimate>dlestimate?ulestimate:dlestimate;

    /* create the three time strings */
    time2str(time_left, total_estimate > 0?(total_estimate - timespent):0);
    time2str(time_total, total_estimate);
    time2str(time_spent, timespent);

    /* Get the total amount of data expected to get transferred */
    total_expected_transfer =
      (data->progress.flags & PGRS_UL_SIZE_KNOWN?
       data->progress.size_ul:data->progress.uploaded)+
      (data->progress.flags & PGRS_DL_SIZE_KNOWN?
       data->progress.size_dl:data->progress.downloaded);

    /* We have transferred this much so far */
    total_transfer = data->progress.downloaded + data->progress.uploaded;

    /* Get the percentage of data transferred so far */
    if(total_expected_transfer > CURL_OFF_T_C(10000))
      total_percen = total_transfer /
        (total_expected_transfer/CURL_OFF_T_C(100));
    else if(total_expected_transfer > CURL_OFF_T_C(0))
      total_percen = (total_transfer*100) / total_expected_transfer;

    fprintf(data->set.err,
            "\r"
            "%3" CURL_FORMAT_CURL_OFF_T " %s  "
            "%3" CURL_FORMAT_CURL_OFF_T " %s  "
            "%3" CURL_FORMAT_CURL_OFF_T " %s  %s  %s %s %s %s %s",
            total_percen,  /* 3 letters */                /* total % */
            max5data(total_expected_transfer, max5[2]),   /* total size */
            dlpercen,      /* 3 letters */                /* rcvd % */
            max5data(data->progress.downloaded, max5[0]), /* rcvd size */
            ulpercen,      /* 3 letters */                /* xfer % */
            max5data(data->progress.uploaded, max5[1]),   /* xfer size */
            max5data(data->progress.dlspeed, max5[3]),    /* avrg dl speed */
            max5data(data->progress.ulspeed, max5[4]),    /* avrg ul speed */
            time_total,    /* 8 letters */                /* total time */
            time_spent,    /* 8 letters */                /* time spent */
            time_left,     /* 8 letters */                /* time left */
            max5data(data->progress.current_speed, max5[5]) /* current speed */
            );

    /* we flush the output stream to make it appear as soon as possible */
    fflush(data->set.err);

  } /* !(data->progress.flags & PGRS_HIDE) */

  return 0;
}